

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O1

int archive_read_format_7zip_read_header(archive_read *a,archive_entry *entry)

{
  uint32_t **ppuVar1;
  _7z_stream_info *si;
  size_t *psVar2;
  _7z_folder *p_Var3;
  long lVar4;
  void *pvVar5;
  uint64_t uVar6;
  size_t sVar7;
  size_t sVar8;
  wchar_t wVar9;
  uint uVar10;
  int iVar11;
  uint32_t *puVar12;
  archive_string_conv *paVar13;
  int *piVar14;
  char *pcVar15;
  char *pcVar16;
  ulong uVar17;
  uLong uVar18;
  int64_t iVar19;
  uchar *puVar20;
  long lVar21;
  uint64_t *puVar22;
  char *pcVar23;
  ulong uVar24;
  bool bVar25;
  int64_t offset;
  size_t size;
  _7z_header_info header;
  archive_format_descriptor *local_90;
  long local_80;
  size_t local_78;
  long local_70;
  _7z_header_info local_68;
  long local_38;
  
  local_90 = a->format;
  si = (_7z_stream_info *)local_90->data;
  if (*(int *)&si[199].pi.digest.digests == -1) {
    *(undefined4 *)&si[199].pi.digest.digests = 0;
  }
  (a->archive).archive_format = 0xe0000;
  if ((a->archive).archive_format_name == (char *)0x0) {
    local_90 = (archive_format_descriptor *)0x5fd485;
    (a->archive).archive_format_name = "7-Zip";
  }
  if (si[1].ci.folders == (_7z_folder *)0x0) {
    local_68.emptyFileBools = (uchar *)0x0;
    local_68.antiBools = (uchar *)0x0;
    local_68.dataIndex = 0;
    local_68.emptyStreamBools = (uchar *)0x0;
    local_68.attrBools = (uchar *)0x0;
    piVar14 = (int *)__archive_read_ahead(a,0x20,&local_80);
    if (piVar14 == (int *)0x0) {
LAB_00535a33:
      local_90 = (archive_format_descriptor *)0xffffffe2;
    }
    else {
      if ((((char)*piVar14 != 'M') || (*(char *)((long)piVar14 + 1) != 'Z')) &&
         (*piVar14 != 0x464c457f)) {
LAB_00535960:
        ppuVar1 = &si[1].pi.digest.digests;
        *ppuVar1 = *ppuVar1 + 8;
        if ((short)piVar14[1] == 0x1c27 && *piVar14 == -0x504385c9) {
          uVar18 = cm_zlib_crc32(0,(uchar *)(piVar14 + 3),0x14);
          if (uVar18 == (uint)piVar14[2]) {
            uVar6 = *(uint64_t *)(piVar14 + 5);
            if (uVar6 == 0) {
              local_90 = (archive_format_descriptor *)0x1;
              goto LAB_00535a39;
            }
            if ((long)((ulong)(uint)piVar14[4] << 0x20) < 0) {
              pcVar15 = "Malformed 7-Zip archive";
              goto LAB_00535a24;
            }
            puVar22 = (uint64_t *)CONCAT44(piVar14[4],piVar14[3]);
            uVar10 = piVar14[7];
            __archive_read_consume(a,0x20);
            if (puVar22 == (uint64_t *)0x0) {
LAB_00535ac2:
              si[2].pi.positions = puVar22;
              si[1].pi.digest.defineds = (uchar *)puVar22;
              si[1].pi.numPackStreams = uVar6;
              si[1].pi.sizes = (uint64_t *)0x0;
              si[1].pi.pos = 1;
              *(undefined4 *)&si[199].pi.digest.digests = 0;
              puVar20 = header_bytes(a,1);
              if (puVar20 == (uchar *)0x0) {
                archive_set_error(&a->archive,0x54,"Truncated 7-Zip file body");
              }
              else {
                if (*puVar20 == '\x01') {
                  bVar25 = false;
                }
                else {
                  if (*puVar20 != '\x17') {
                    archive_set_error(&a->archive,-1,"Unexpected Property ID = %X");
                    goto LAB_00535a33;
                  }
                  iVar11 = decode_encoded_header_info(a,si);
                  if ((iVar11 == 0) && (iVar11 = 0, si[1].pi.sizes != (uint64_t *)(ulong)uVar10)) {
                    iVar11 = -1;
                    archive_set_error(&a->archive,-1,"Damaged 7-Zip archive");
                  }
                  bVar25 = true;
                  if (iVar11 == 0) {
                    p_Var3 = (si->ci).folders;
                    bVar25 = p_Var3->digest_defined != '\0';
                    if (bVar25) {
                      uVar10 = p_Var3->digest;
                    }
                    if (si[2].ss.unpackSizes != (uint64_t *)0x0) {
                      read_consume(a);
                    }
                    iVar11 = setup_decode_folder(a,(si->ci).folders,1);
                    if (iVar11 == 0) {
                      si[1].pi.numPackStreams = (uint64_t)si[2].ci.folders;
                      iVar11 = seek_pack(a);
                    }
                  }
                  free_StreamsInfo(si);
                  (si->ss).unpackSizes = (uint64_t *)0x0;
                  (si->ss).digestsDefined = (uchar *)0x0;
                  (si->ci).dataStreamIndex = 0;
                  (si->ss).unpack_streams = 0;
                  (si->ci).numFolders = 0;
                  (si->ci).folders = (_7z_folder *)0x0;
                  (si->pi).digest.digests = (uint32_t *)0x0;
                  (si->pi).positions = (uint64_t *)0x0;
                  (si->pi).sizes = (uint64_t *)0x0;
                  (si->pi).digest.defineds = (uchar *)0x0;
                  (si->pi).pos = 0;
                  (si->pi).numPackStreams = 0;
                  (si->ss).digests = (uint32_t *)0x0;
                  if (iVar11 < 0) {
                    local_90 = (archive_format_descriptor *)0xffffffe2;
                    goto LAB_00535a39;
                  }
                  *(undefined4 *)((long)&si[1].pi.pos + 4) = 1;
                  si[1].pi.sizes = (uint64_t *)0x0;
                  bVar25 = !bVar25;
                }
                piVar14 = __errno_location();
                *piVar14 = 0;
                iVar11 = read_Header(a,&local_68,*(int *)((long)&si[1].pi.pos + 4));
                if (iVar11 < 0) {
                  if (*piVar14 == 0xc) {
                    pcVar15 = "Couldn\'t allocate memory";
                  }
                  else {
                    pcVar15 = "Damaged 7-Zip archive";
                  }
                  goto LAB_00535a24;
                }
                puVar20 = header_bytes(a,1);
                if (((puVar20 != (uchar *)0x0) && (*puVar20 == '\0')) &&
                   ((bVar25 || (si[1].pi.sizes == (uint64_t *)(ulong)uVar10)))) {
                  local_90 = (archive_format_descriptor *)0x0;
                  si[2].pi.digest.digests = (uint32_t *)0x0;
                  si[2].ss.unpackSizes = (uint64_t *)0x0;
                  *(undefined4 *)&si[1].pi.pos = 0;
                  si[2].ci.folders = (_7z_folder *)0x0;
                  si[2].ci.dataStreamIndex = 0;
                  goto LAB_00535a39;
                }
                archive_set_error(&a->archive,-1,"Malformed 7-Zip archive");
              }
            }
            else {
              if ((long)puVar22 <= local_80) {
                __archive_read_consume(a,(int64_t)puVar22);
                goto LAB_00535ac2;
              }
              iVar19 = __archive_read_seek(a,(long)si[1].pi.digest.digests + (long)puVar22,0);
              if (-1 < iVar19) goto LAB_00535ac2;
            }
            local_90 = (archive_format_descriptor *)0xffffffe2;
            goto LAB_00535a39;
          }
          pcVar15 = "Header CRC error";
        }
        else {
          pcVar15 = "Not 7-Zip archive file";
        }
LAB_00535a24:
        archive_set_error(&a->archive,-1,pcVar15);
        goto LAB_00535a33;
      }
      if (local_80 < 0x27001) {
        iVar19 = __archive_read_seek(a,0x27000,0);
        if (-1 < iVar19) goto LAB_00535747;
        local_90 = (archive_format_descriptor *)0xffffffe2;
        bVar25 = true;
      }
      else {
        __archive_read_consume(a,0x27000);
LAB_00535747:
        lVar21 = 0;
        uVar24 = 1;
        do {
          while (pcVar15 = (char *)__archive_read_ahead(a,uVar24,(ssize_t *)&local_78),
                pcVar15 == (char *)0x0) {
            if (uVar24 < 0x80) goto LAB_00535864;
            uVar17 = uVar24 >> 1;
LAB_00535811:
            uVar24 = uVar17;
            if (0x39000 < uVar17 + lVar21) goto LAB_00535864;
          }
          uVar17 = 0x1000;
          if ((long)local_78 < 6) goto LAB_00535811;
          pcVar23 = pcVar15 + local_78;
          local_38 = lVar21 + 0x27000;
          local_70 = lVar21;
          for (pcVar16 = pcVar15; pcVar16 + 0x20 < pcVar23; pcVar16 = pcVar16 + uVar10) {
            uVar10 = check_7zip_header_in_sfx(pcVar16);
            if (uVar10 == 0) {
              pvVar5 = a->format->data;
              __archive_read_consume(a,(long)pcVar16 - (long)pcVar15);
              *(long *)((long)pvVar5 + 0x88) = ((long)pcVar16 - (long)pcVar15) + local_38;
              bVar25 = false;
              local_90 = (archive_format_descriptor *)0x0;
              goto LAB_0053593a;
            }
          }
          __archive_read_consume(a,(long)pcVar16 - (long)pcVar15);
          lVar21 = lVar21 + ((long)pcVar16 - (long)pcVar15);
          if (uVar24 == 1) {
            uVar24 = 0x1000;
          }
        } while (lVar21 + uVar24 < 0x39001);
LAB_00535864:
        archive_set_error(&a->archive,0x54,"Couldn\'t find out 7-Zip header");
        local_90 = (archive_format_descriptor *)0xffffffe2;
        bVar25 = true;
      }
LAB_0053593a:
      if (!bVar25) {
        piVar14 = (int *)__archive_read_ahead(a,0x20,&local_80);
        if (piVar14 == (int *)0x0) goto LAB_00535a33;
        goto LAB_00535960;
      }
    }
LAB_00535a39:
    free(local_68.emptyStreamBools);
    free(local_68.emptyFileBools);
    free(local_68.antiBools);
    free(local_68.attrBools);
    if ((int)local_90 != 0) {
      return (int)local_90;
    }
    p_Var3 = si[1].ci.folders;
    si[1].pi.positions = (uint64_t *)si[1].ci.numFolders;
    si[1].ci.dataStreamIndex = (uint64_t)p_Var3;
  }
  else {
    puVar22 = &si[1].ci.dataStreamIndex;
    *puVar22 = *puVar22 + 0x58;
  }
  puVar22 = si[1].pi.positions;
  psVar2 = (size_t *)si[1].ci.dataStreamIndex;
  if (psVar2 == (size_t *)0x0 || puVar22 == (uint64_t *)0x0) {
    return 1;
  }
  si[1].pi.positions = (uint64_t *)((long)puVar22 + -1);
  si[1].ss.unpackSizes = (uint64_t *)0x0;
  *(undefined1 *)&si[2].pi.pos = 0;
  puVar12 = (uint32_t *)cm_zlib_crc32(0,(uchar *)0x0,0);
  si[1].ss.digests = puVar12;
  if (si[0xc6].ci.dataStreamIndex == 0) {
    paVar13 = archive_string_conversion_from_charset(&a->archive,"UTF-16LE",L'\x01');
    si[0xc6].ci.dataStreamIndex = (uint64_t)paVar13;
    if (paVar13 != (archive_string_conv *)0x0) goto LAB_00535449;
LAB_0053551e:
    iVar11 = -0x1e;
  }
  else {
LAB_00535449:
    sVar7 = psVar2[2];
    if (((ulong)(uint)sVar7 < (si->ci).numFolders) &&
       (p_Var3 = (si->ci).folders, p_Var3 != (_7z_folder *)0x0)) {
      uVar24 = 0xffffffffffffffff;
      lVar21 = 0;
      do {
        uVar24 = uVar24 + 1;
        if (p_Var3[(uint)sVar7].numCoders <= uVar24) break;
        lVar4 = *(long *)((long)&(p_Var3[(uint)sVar7].coders)->codec + lVar21);
        if (((lVar4 == 0x6f10101) || (lVar4 == 0x6f10701)) || (lVar4 == 0x6f10303)) {
          archive_entry_set_is_data_encrypted(entry,'\x01');
          *(undefined4 *)&si[199].pi.digest.digests = 1;
        }
        lVar21 = lVar21 + 0x28;
      } while (p_Var3 != (_7z_folder *)0x0);
    }
    if (*(int *)&si[199].pi.digest.digests == -1) {
      *(undefined4 *)&si[199].pi.digest.digests = 0;
    }
    wVar9 = _archive_entry_copy_pathname_l
                      (entry,(char *)psVar2[1],*psVar2,
                       (archive_string_conv *)si[0xc6].ci.dataStreamIndex);
    if (wVar9 == L'\0') {
      iVar11 = 0;
    }
    else {
      piVar14 = __errno_location();
      if (*piVar14 == 0xc) {
        archive_set_error(&a->archive,0xc,"Can\'t allocate memory for Pathname");
        goto LAB_0053551e;
      }
      pcVar15 = archive_string_conversion_charset_name
                          ((archive_string_conv *)si[0xc6].ci.dataStreamIndex);
      archive_set_error(&a->archive,0x54,"Pathname cannot be converted from %s to current locale.",
                        pcVar15);
      iVar11 = -0x14;
    }
    archive_entry_set_mode(entry,(mode_t)psVar2[10]);
    if ((psVar2[3] & 1) != 0) {
      archive_entry_set_mtime(entry,psVar2[4],psVar2[7]);
    }
    if ((psVar2[3] & 4) != 0) {
      archive_entry_set_ctime(entry,psVar2[6],psVar2[9]);
    }
    if ((psVar2[3] & 2) != 0) {
      archive_entry_set_atime(entry,psVar2[5],psVar2[8]);
    }
    if ((ulong)*(uint *)((long)psVar2 + 0x14) == 0xffffffff) {
      puVar20 = (uchar *)0x0;
    }
    else {
      puVar20 = (uchar *)(si->ss).unpackSizes[*(uint *)((long)psVar2 + 0x14)];
    }
    si[1].ss.digestsDefined = puVar20;
    archive_entry_set_size(entry,(la_int64_t)puVar20);
    if (si[1].ss.digestsDefined == (uchar *)0x0) {
      *(undefined1 *)&si[2].pi.pos = 1;
    }
    if ((psVar2[10] & 0xf000) == 0xa000) {
      local_70 = CONCAT44(local_70._4_4_,iVar11);
      lVar21 = 0;
      pcVar15 = (char *)0x0;
      do {
        puVar20 = si[1].ss.digestsDefined;
        if (puVar20 == (uchar *)0x0) {
          if (lVar21 == 0) {
            uVar10 = (uint)psVar2[10] & 0xffff0fff | 0x8000;
            *(uint *)(psVar2 + 10) = uVar10;
            archive_entry_set_mode(entry,uVar10);
          }
          else {
            pcVar15[lVar21] = '\0';
            archive_entry_copy_symlink(entry,pcVar15);
          }
          free(pcVar15);
          archive_entry_set_size(entry,0);
          break;
        }
        uVar10 = archive_read_format_7zip_read_data(a,(void **)&local_68,&local_78,&local_80);
        if ((int)uVar10 < -0x14) {
          free(pcVar15);
          local_90 = (archive_format_descriptor *)(ulong)uVar10;
LAB_00535718:
          bVar25 = false;
          pcVar16 = pcVar15;
        }
        else {
          pcVar16 = (char *)realloc(pcVar15,lVar21 + local_78 + 1);
          sVar8 = local_78;
          if (pcVar16 == (char *)0x0) {
            free(pcVar15);
            archive_set_error(&a->archive,0xc,"Can\'t allocate memory for Symname");
            local_90 = (archive_format_descriptor *)0xffffffe2;
            goto LAB_00535718;
          }
          memcpy(pcVar16 + lVar21,(void *)local_68.dataIndex,local_78);
          lVar21 = lVar21 + sVar8;
          bVar25 = true;
        }
        pcVar15 = pcVar16;
      } while (bVar25);
      iVar11 = (int)local_70;
      if (puVar20 != (uchar *)0x0) {
        return (int)local_90;
      }
    }
    *(undefined2 *)((long)&si[0xc6].ss.unpack_streams + 4) = 0x70;
    *(undefined4 *)&si[0xc6].ss.unpack_streams = 0x695a2d37;
    (a->archive).archive_format_name = (char *)&si[0xc6].ss;
  }
  return iVar11;
}

Assistant:

static int
archive_read_format_7zip_read_header(struct archive_read *a,
	struct archive_entry *entry)
{
	struct _7zip *zip = (struct _7zip *)a->format->data;
	struct _7zip_entry *zip_entry;
	int r, ret = ARCHIVE_OK;
	struct _7z_folder *folder = 0;
	uint64_t fidx = 0;

	/*
	 * It should be sufficient to call archive_read_next_header() for
	 * a reader to determine if an entry is encrypted or not. If the
	 * encryption of an entry is only detectable when calling
	 * archive_read_data(), so be it. We'll do the same check there
	 * as well.
	 */
	if (zip->has_encrypted_entries == ARCHIVE_READ_FORMAT_ENCRYPTION_DONT_KNOW) {
		zip->has_encrypted_entries = 0;
	}

	a->archive.archive_format = ARCHIVE_FORMAT_7ZIP;
	if (a->archive.archive_format_name == NULL)
		a->archive.archive_format_name = "7-Zip";

	if (zip->entries == NULL) {
		struct _7z_header_info header;

		memset(&header, 0, sizeof(header));
		r = slurp_central_directory(a, zip, &header);
		free_Header(&header);
		if (r != ARCHIVE_OK)
			return (r);
		zip->entries_remaining = (size_t)zip->numFiles;
		zip->entry = zip->entries;
	} else {
		++zip->entry;
	}
	zip_entry = zip->entry;

	if (zip->entries_remaining <= 0 || zip_entry == NULL)
		return ARCHIVE_EOF;
	--zip->entries_remaining;

	zip->entry_offset = 0;
	zip->end_of_entry = 0;
	zip->entry_crc32 = crc32(0, NULL, 0);

	/* Setup a string conversion for a filename. */
	if (zip->sconv == NULL) {
		zip->sconv = archive_string_conversion_from_charset(
		    &a->archive, "UTF-16LE", 1);
		if (zip->sconv == NULL)
			return (ARCHIVE_FATAL);
	}

	/* Figure out if the entry is encrypted by looking at the folder
	   that is associated to the current 7zip entry. If the folder
	   has a coder with a _7Z_CRYPTO codec then the folder is encrypted.
	   Hence the entry must also be encrypted. */
	if (zip_entry && zip_entry->folderIndex < zip->si.ci.numFolders) {
		folder = &(zip->si.ci.folders[zip_entry->folderIndex]);
		for (fidx=0; folder && fidx<folder->numCoders; fidx++) {
			switch(folder->coders[fidx].codec) {
				case _7Z_CRYPTO_MAIN_ZIP:
				case _7Z_CRYPTO_RAR_29:
				case _7Z_CRYPTO_AES_256_SHA_256: {
					archive_entry_set_is_data_encrypted(entry, 1);
					zip->has_encrypted_entries = 1;
					break;
				}
			}
		}
	}

	/* Now that we've checked for encryption, if there were still no
	 * encrypted entries found we can say for sure that there are none.
	 */
	if (zip->has_encrypted_entries == ARCHIVE_READ_FORMAT_ENCRYPTION_DONT_KNOW) {
		zip->has_encrypted_entries = 0;
	}

	if (archive_entry_copy_pathname_l(entry,
	    (const char *)zip_entry->utf16name,
	    zip_entry->name_len, zip->sconv) != 0) {
		if (errno == ENOMEM) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for Pathname");
			return (ARCHIVE_FATAL);
		}
		archive_set_error(&a->archive,
		    ARCHIVE_ERRNO_FILE_FORMAT,
		    "Pathname cannot be converted "
		    "from %s to current locale.",
		    archive_string_conversion_charset_name(zip->sconv));
		ret = ARCHIVE_WARN;
	}

	/* Populate some additional entry fields: */
	archive_entry_set_mode(entry, zip_entry->mode);
	if (zip_entry->flg & MTIME_IS_SET)
		archive_entry_set_mtime(entry, zip_entry->mtime,
			zip_entry->mtime_ns);
	if (zip_entry->flg & CTIME_IS_SET)
		archive_entry_set_ctime(entry, zip_entry->ctime,
		    zip_entry->ctime_ns);
	if (zip_entry->flg & ATIME_IS_SET)
		archive_entry_set_atime(entry, zip_entry->atime,
		    zip_entry->atime_ns);
	if (zip_entry->ssIndex != (uint32_t)-1) {
		zip->entry_bytes_remaining =
		    zip->si.ss.unpackSizes[zip_entry->ssIndex];
		archive_entry_set_size(entry, zip->entry_bytes_remaining);
	} else {
		zip->entry_bytes_remaining = 0;
		archive_entry_set_size(entry, 0);
	}

	/* If there's no body, force read_data() to return EOF immediately. */
	if (zip->entry_bytes_remaining < 1)
		zip->end_of_entry = 1;

	if ((zip_entry->mode & AE_IFMT) == AE_IFLNK) {
		unsigned char *symname = NULL;
		size_t symsize = 0;

		/*
		 * Symbolic-name is recorded as its contents. We have to
		 * read the contents at this time.
		 */
		while (zip->entry_bytes_remaining > 0) {
			const void *buff;
			unsigned char *mem;
			size_t size;
			int64_t offset;

			r = archive_read_format_7zip_read_data(a, &buff,
				&size, &offset);
			if (r < ARCHIVE_WARN) {
				free(symname);
				return (r);
			}
			mem = realloc(symname, symsize + size + 1);
			if (mem == NULL) {
				free(symname);
				archive_set_error(&a->archive, ENOMEM,
				    "Can't allocate memory for Symname");
				return (ARCHIVE_FATAL);
			}
			symname = mem;
			memcpy(symname+symsize, buff, size);
			symsize += size;
		}
		if (symsize == 0) {
			/* If there is no symname, handle it as a regular
			 * file. */
			zip_entry->mode &= ~AE_IFMT;
			zip_entry->mode |= AE_IFREG;
			archive_entry_set_mode(entry, zip_entry->mode);
		} else {
			symname[symsize] = '\0';
			archive_entry_copy_symlink(entry,
			    (const char *)symname);
		}
		free(symname);
		archive_entry_set_size(entry, 0);
	}

	/* Set up a more descriptive format name. */
	sprintf(zip->format_name, "7-Zip");
	a->archive.archive_format_name = zip->format_name;

	return (ret);
}